

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

int __thiscall
DnsStats::SubmitName
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,bool should_tabulate)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  bool stored;
  DnsHashEntry key;
  bool local_99;
  DnsHashEntry local_98;
  
  if (start < length) {
    while( true ) {
      bVar2 = packet[start];
      uVar3 = (uint)bVar2;
      if (bVar2 == 0) {
        if (should_tabulate) {
          local_98.HashNext = (DnsHashEntry *)0x0;
          local_98.field_6.key_number = 0;
          local_99 = false;
          local_98.count = 1;
          local_98.hash = 0;
          local_98.registry_id = 7;
          local_98.key_type = 0;
          local_98.key_length = 4;
          BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&local_99);
        }
        return start + 1;
      }
      if ((~uVar3 & 0xc0) == 0) break;
      if (0x3f < bVar2) {
        *(byte *)&this->error_flags = (byte)this->error_flags | 0x80;
        if (!should_tabulate) {
          return length;
        }
        local_98.HashNext = (DnsHashEntry *)0x0;
        local_99 = false;
        local_98.count = 1;
        local_98.hash = 0;
        local_98.registry_id = 7;
        local_98.key_type = 0;
        local_98.key_length = 4;
        local_98.field_6.key_number = uVar3;
        BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&local_99);
        return length;
      }
      if (should_tabulate) {
        local_98.HashNext = (DnsHashEntry *)0x0;
        local_98.field_6.key_number = 0;
        local_99 = false;
        local_98.count = 1;
        local_98.hash = 0;
        local_98.registry_id = 7;
        local_98.key_type = 0;
        local_98.key_length = 4;
        BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&local_99);
      }
      if (length < start + uVar3 + 1) goto LAB_0018bbe5;
      start = start + uVar3 + 1;
      if (length <= start) {
        return start;
      }
    }
    if (should_tabulate) {
      local_98.HashNext = (DnsHashEntry *)0x0;
      local_99 = false;
      local_98.count = 1;
      local_98.hash = 0;
      local_98.registry_id = 7;
      local_98.key_type = 0;
      local_98.key_length = 4;
      local_98.field_6.key_number = 0xc0;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&local_99);
    }
    start = start + 2;
    if (length < start) {
LAB_0018bbe5:
      pbVar1 = (byte *)((long)&this->error_flags + 1);
      *pbVar1 = *pbVar1 | 1;
      start = length;
    }
  }
  return start;
}

Assistant:

int DnsStats::SubmitName(uint8_t * packet, uint32_t length, uint32_t start, bool should_tabulate)
{
    uint32_t l = 0;

    while (start < length)
    {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0);
            }
            start++;
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            /* Name compression */
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0xC0);
            }

            if ((start + 2) > length)
            {
                error_flags |= DNS_REGISTRY_ERROR_FORMAT;
                start = length;
                break;
            }
            else
            {
                start += 2;
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            error_flags |= DNS_REGISTRY_ERROR_LABEL;
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, l);
            }
            start = length;
            break;
        }
        else
        {
            /* regular name part. To do: tracking of underscore labels. */
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0);
            }
            if (start + l + 1 > length)
            {
                error_flags |= DNS_REGISTRY_ERROR_FORMAT;
                start = length;
                break;
            }
            else
            {
                start += l + 1;
            }
        }
    }

    return start;
}